

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildFromVar
          (IRBuilderAsmJs *this,uint32 offset,RegSlot dstRegSlot,RegSlot srcRegSlot,IRType irType,
          ValueType valueType)

{
  RegSlot srcRegSlot_00;
  RegOpnd *src1Opnd;
  RegOpnd *this_00;
  Instr *instr;
  
  srcRegSlot_00 = GetRegSlotFromInt64Reg(this,srcRegSlot);
  src1Opnd = BuildSrcOpnd(this,srcRegSlot_00,TyVar);
  this_00 = BuildDstOpnd(this,dstRegSlot,irType);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  instr = IR::Instr::New(FromVar,&this_00->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildFromVar(uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot, IRType irType, ValueType valueType)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(GetRegSlotFromPtrReg(srcRegSlot), TyVar);
    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, irType);
    dstOpnd->SetValueType(valueType);

    IR::Instr * instr = IR::Instr::New(Js::OpCode::FromVar, dstOpnd, srcOpnd, m_func);

    AddInstr(instr, offset);
}